

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void reallymarkobject(global_State *g,GCObject *o)

{
  GCObject *pGVar1;
  ulong uVar2;
  GCObject **ppGVar3;
  byte bVar4;
  byte bVar5;
  Udata *u;
  
  while (bVar5 = o->tt, bVar5 == 9) {
    pGVar1 = o[1].next;
    bVar4 = o->marked & 199;
    bVar5 = bVar4 + 0x20;
    if (pGVar1 != (GCObject *)&o[1].tt) {
      bVar5 = bVar4;
    }
    o->marked = bVar5;
    if ((pGVar1->tt & 0x40) == 0) {
      return;
    }
    o = pGVar1->next;
    if ((o->marked & 0x18) == 0) {
      return;
    }
  }
  if (0x26 < bVar5) {
    return;
  }
  uVar2 = (ulong)bVar5;
  if ((0x4000000560U >> (uVar2 & 0x3f) & 1) == 0) {
    if ((0x100010UL >> (uVar2 & 0x3f) & 1) != 0) {
      o->marked = o->marked & 199 | 0x20;
      return;
    }
    if (uVar2 != 7) {
      return;
    }
    if (*(short *)&o->field_0xa == 0) {
      pGVar1 = *(GCObject **)&o[1].tt;
      if ((pGVar1 != (GCObject *)0x0) && ((pGVar1->marked & 0x18) != 0)) {
        reallymarkobject(g,pGVar1);
      }
      o->marked = o->marked & 199 | 0x20;
      return;
    }
  }
  ppGVar3 = getgclist(o);
  *ppGVar3 = g->gray;
  g->gray = o;
  o->marked = o->marked & 199;
  return;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
  switch (o->tt) {
    case LUA_VSHRSTR:
    case LUA_VLNGSTR: {
      set2black(o);  /* nothing to visit */
      break;
    }
    case LUA_VUPVAL: {
      UpVal *uv = gco2upv(o);
      if (upisopen(uv))
        set2gray(uv);  /* open upvalues are kept gray */
      else
        set2black(uv);  /* closed upvalues are visited here */
      markvalue(g, uv->v.p);  /* mark its content */
      break;
    }
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      if (u->nuvalue == 0) {  /* no user values? */
        markobjectN(g, u->metatable);  /* mark its metatable */
        set2black(u);  /* nothing else to mark */
        break;
      }
      /* else... */
    }  /* FALLTHROUGH */
    case LUA_VLCL: case LUA_VCCL: case LUA_VTABLE:
    case LUA_VTHREAD: case LUA_VPROTO: {
      linkobjgclist(o, g->gray);  /* to be visited later */
      break;
    }
    default: lua_assert(0); break;
  }
}